

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O0

bool QtPrivate::
     q_points_into_range<QArrayDataPointer<std::pair<QString,int>>,std::pair<QString,int>const*>
               (pair<QString,_int> **p,QArrayDataPointer<std::pair<QString,_int>_> *c)

{
  undefined8 uVar1;
  bool bVar2;
  pair<QString,_int> *__last;
  pair<QString,_int> *__first;
  difference_type dVar3;
  undefined8 *in_RDI;
  
  uVar1 = *in_RDI;
  __last = std::data<QArrayDataPointer<std::pair<QString,int>>>
                     ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bc585);
  __first = std::data<QArrayDataPointer<std::pair<QString,int>>>
                      ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bc594);
  std::begin<QArrayDataPointer<std::pair<QString,int>>>
            ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bc5a3);
  std::end<QArrayDataPointer<std::pair<QString,int>>>
            ((QArrayDataPointer<std::pair<QString,_int>_> *)0x8bc5b4);
  dVar3 = std::distance<std::pair<QString,int>const*>(__first,__last);
  bVar2 = q_points_into_range<std::pair<QString,int>,std::less<void>>(uVar1,__last,__first + dVar3);
  return bVar2;
}

Assistant:

static constexpr bool q_points_into_range(const T &p, const C &c) noexcept
{
    static_assert(std::is_same_v<decltype(std::data(c)), T>);

    // std::distance because QArrayDataPointer has a "qsizetype size"
    // member but no size() function
    return q_points_into_range(p, std::data(c),
                               std::data(c) + std::distance(std::begin(c), std::end(c)));
}